

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_operators.hpp
# Opt level: O2

string * __thiscall
viennamath::op_unary<viennamath::op_log10<double>,viennamath::rt_expression_interface<double>>::
str_abi_cxx11_(string *__return_storage_ptr__,void *this)

{
  op_log10<double>::str_abi_cxx11_();
  return __return_storage_ptr__;
}

Assistant:

std::string str() const { return unary_op_.str(); }